

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_spatializer_listener_init
                    (ma_spatializer_listener_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_spatializer_listener *pListener
                    )

{
  ma_result mVar1;
  void *pHeap;
  ulong sz;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pConfig != (ma_spatializer_listener_config *)0x0) && ((ulong)pConfig->channelsOut != 0)) {
    sz = (ulong)pConfig->channelsOut + 7 & 0x1fffffff8;
    if (sz == 0) {
      pHeap = (void *)0x0;
    }
    else {
      pHeap = ma_malloc(sz,pAllocationCallbacks);
      if (pHeap == (void *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
    }
    mVar1 = ma_spatializer_listener_init_preallocated(pConfig,pHeap,pListener);
    if (mVar1 == MA_SUCCESS) {
      pListener->_ownsHeap = 1;
      mVar1 = MA_SUCCESS;
    }
    else {
      ma_free(pHeap,pAllocationCallbacks);
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_spatializer_listener_init(const ma_spatializer_listener_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_spatializer_listener* pListener)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_spatializer_listener_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_spatializer_listener_init_preallocated(pConfig, pHeap, pListener);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pListener->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}